

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O2

int archive_write_shar_header(archive_write *a,archive_entry *entry)

{
  archive_string *buf;
  archive_string *as;
  int *piVar1;
  mode_t mVar2;
  int iVar3;
  archive_entry *paVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  size_t sVar7;
  char *pcVar8;
  dev_t dVar9;
  dev_t dVar10;
  la_int64_t lVar11;
  
  piVar1 = (int *)a->format_data;
  if (piVar1[0x16] == 0) {
    archive_strcat((archive_string *)(piVar1 + 0x18),"#!/bin/sh\n");
    archive_strcat((archive_string *)(piVar1 + 0x18),"# This is a shell archive\n");
    piVar1[0x16] = 1;
  }
  if (*(archive_entry **)(piVar1 + 2) != (archive_entry *)0x0) {
    archive_entry_free(*(archive_entry **)(piVar1 + 2));
  }
  paVar4 = archive_entry_clone(entry);
  *(archive_entry **)(piVar1 + 2) = paVar4;
  pcVar5 = archive_entry_pathname(entry);
  mVar2 = archive_entry_filetype(entry);
  switch(mVar2 << 0x14 | mVar2 - 0x1000 >> 0xc) {
  case 0:
  case 1:
  case 5:
    archive_entry_set_size(entry,0);
    break;
  default:
    archive_entry_set_size(entry,0);
    pcVar8 = archive_entry_hardlink(entry);
    if ((pcVar8 == (char *)0x0) && (pcVar8 = archive_entry_symlink(entry), pcVar8 == (char *)0x0)) {
      archive_set_error(&a->archive,-1,"shar format cannot archive this");
      return -0x14;
    }
    break;
  case 3:
    archive_entry_set_size(entry,0);
    if (*pcVar5 == '.') {
      if (pcVar5[1] == '\0') {
        return 0;
      }
      if ((pcVar5[1] == '/') && (pcVar5[2] == '\0')) {
        return 0;
      }
    }
    break;
  case 7:
    break;
  }
  buf = (archive_string *)(piVar1 + 0x1e);
  piVar1[0x20] = 0;
  piVar1[0x21] = 0;
  shar_quote(buf,pcVar5,1);
  as = (archive_string *)(piVar1 + 0x18);
  archive_string_sprintf(as,"echo x %s\n",*(undefined8 *)(piVar1 + 0x1e));
  mVar2 = archive_entry_filetype(entry);
  if (mVar2 != 0x4000) {
    pcVar8 = strdup(pcVar5);
    pcVar6 = strrchr(pcVar8,0x2f);
    if ((pcVar6 == (char *)0x0) || ((*pcVar6 = '\0', *pcVar8 == '.' && (pcVar8[1] == '\0')))) {
      free(pcVar8);
    }
    else {
      pcVar6 = *(char **)(piVar1 + 6);
      if (pcVar6 == (char *)0x0) {
LAB_00489a7f:
        archive_strcat(as,"mkdir -p ");
        shar_quote(as,pcVar8,1);
        archive_strcat(as," > /dev/null 2>&1\n");
        *(char **)(piVar1 + 6) = pcVar8;
      }
      else {
        iVar3 = strcmp(pcVar8,pcVar6);
        if (iVar3 != 0) {
          __n = strlen(pcVar8);
          sVar7 = strlen(pcVar6);
          if ((sVar7 <= __n) || (iVar3 = strncmp(pcVar8,pcVar6,__n), iVar3 != 0)) goto LAB_00489a7f;
        }
        free(pcVar8);
      }
    }
  }
  piVar1[4] = 0;
  pcVar8 = archive_entry_hardlink(entry);
  if (pcVar8 != (char *)0x0) {
    pcVar5 = "ln -f ";
LAB_00489b85:
    archive_strcat(as,pcVar5);
    shar_quote(as,pcVar8,1);
    pcVar5 = buf->s;
    pcVar8 = " %s\n";
LAB_00489ba5:
    archive_string_sprintf(as,pcVar8,pcVar5);
    return 0;
  }
  pcVar8 = archive_entry_symlink(entry);
  if (pcVar8 != (char *)0x0) {
    pcVar5 = "ln -fs ";
    goto LAB_00489b85;
  }
  mVar2 = archive_entry_filetype(entry);
  iVar3 = -0x14;
  switch(mVar2 << 0x14 | mVar2 - 0x1000 >> 0xc) {
  case 0:
    pcVar5 = buf->s;
    pcVar8 = "mkfifo %s\n";
    goto LAB_00489ba5;
  case 1:
    pcVar5 = buf->s;
    dVar9 = archive_entry_rdevmajor(entry);
    dVar10 = archive_entry_rdevminor(entry);
    pcVar8 = "mknod %s c %ju %ju\n";
    goto LAB_00489c8b;
  case 3:
    iVar3 = 0;
    archive_string_sprintf(as,"mkdir -p %s > /dev/null 2>&1\n",*(undefined8 *)(piVar1 + 0x1e));
    free(*(void **)(piVar1 + 6));
    pcVar5 = strdup(pcVar5);
    *(char **)(piVar1 + 6) = pcVar5;
    pcVar5 = strrchr(pcVar5,0x2f);
    if ((pcVar5 != (char *)0x0) && (pcVar5[1] == '\0')) {
      *pcVar5 = '\0';
    }
    break;
  case 5:
    pcVar5 = buf->s;
    dVar9 = archive_entry_rdevmajor(entry);
    dVar10 = archive_entry_rdevminor(entry);
    pcVar8 = "mknod %s b %ju %ju\n";
LAB_00489c8b:
    iVar3 = 0;
    archive_string_sprintf(as,pcVar8,pcVar5,dVar9,dVar10);
    break;
  case 7:
    lVar11 = archive_entry_size(entry);
    if (lVar11 == 0) {
      iVar3 = 0;
      archive_string_sprintf(as,"test -e \"%s\" || :> \"%s\"\n",buf->s);
    }
    else {
      if (*piVar1 == 0) {
        archive_string_sprintf(as,"sed \'s/^X//\' > %s << \'SHAR_END\'\n",buf->s);
      }
      else {
        mVar2 = archive_entry_mode(entry);
        archive_string_sprintf(as,"uudecode -p > %s << \'SHAR_END\'\n",buf->s);
        archive_string_sprintf(as,"begin %o ",(ulong)(mVar2 & 0x1ff));
        shar_quote(as,pcVar5,0);
        archive_strcat(as,"\n");
      }
      piVar1[4] = 1;
      piVar1[1] = 1;
      piVar1[0x14] = 0;
      piVar1[0x15] = 0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
archive_write_shar_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *linkname;
	const char *name;
	char *p, *pp;
	struct shar *shar;

	shar = (struct shar *)a->format_data;
	if (!shar->wrote_header) {
		archive_strcat(&shar->work, "#!/bin/sh\n");
		archive_strcat(&shar->work, "# This is a shell archive\n");
		shar->wrote_header = 1;
	}

	/* Save the entry for the closing. */
	if (shar->entry)
		archive_entry_free(shar->entry);
	shar->entry = archive_entry_clone(entry);
	name = archive_entry_pathname(entry);

	/* Handle some preparatory issues. */
	switch(archive_entry_filetype(entry)) {
	case AE_IFREG:
		/* Only regular files have non-zero size. */
		break;
	case AE_IFDIR:
		archive_entry_set_size(entry, 0);
		/* Don't bother trying to recreate '.' */
		if (strcmp(name, ".") == 0  ||  strcmp(name, "./") == 0)
			return (ARCHIVE_OK);
		break;
	case AE_IFIFO:
	case AE_IFCHR:
	case AE_IFBLK:
		/* All other file types have zero size in the archive. */
		archive_entry_set_size(entry, 0);
		break;
	default:
		archive_entry_set_size(entry, 0);
		if (archive_entry_hardlink(entry) == NULL &&
		    archive_entry_symlink(entry) == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "shar format cannot archive this");
			return (ARCHIVE_WARN);
		}
	}

	archive_string_empty(&shar->quoted_name);
	shar_quote(&shar->quoted_name, name, 1);

	/* Stock preparation for all file types. */
	archive_string_sprintf(&shar->work, "echo x %s\n", shar->quoted_name.s);

	if (archive_entry_filetype(entry) != AE_IFDIR) {
		/* Try to create the dir. */
		p = strdup(name);
		pp = strrchr(p, '/');
		/* If there is a / character, try to create the dir. */
		if (pp != NULL) {
			*pp = '\0';

			/* Try to avoid a lot of redundant mkdir commands. */
			if (strcmp(p, ".") == 0) {
				/* Don't try to "mkdir ." */
				free(p);
			} else if (shar->last_dir == NULL) {
				archive_strcat(&shar->work, "mkdir -p ");
				shar_quote(&shar->work, p, 1);
				archive_strcat(&shar->work,
				    " > /dev/null 2>&1\n");
				shar->last_dir = p;
			} else if (strcmp(p, shar->last_dir) == 0) {
				/* We've already created this exact dir. */
				free(p);
			} else if (strlen(p) < strlen(shar->last_dir) &&
			    strncmp(p, shar->last_dir, strlen(p)) == 0) {
				/* We've already created a subdir. */
				free(p);
			} else {
				archive_strcat(&shar->work, "mkdir -p ");
				shar_quote(&shar->work, p, 1);
				archive_strcat(&shar->work,
				    " > /dev/null 2>&1\n");
				shar->last_dir = p;
			}
		} else {
			free(p);
		}
	}

	/* Handle file-type specific issues. */
	shar->has_data = 0;
	if ((linkname = archive_entry_hardlink(entry)) != NULL) {
		archive_strcat(&shar->work, "ln -f ");
		shar_quote(&shar->work, linkname, 1);
		archive_string_sprintf(&shar->work, " %s\n",
		    shar->quoted_name.s);
	} else if ((linkname = archive_entry_symlink(entry)) != NULL) {
		archive_strcat(&shar->work, "ln -fs ");
		shar_quote(&shar->work, linkname, 1);
		archive_string_sprintf(&shar->work, " %s\n",
		    shar->quoted_name.s);
	} else {
		switch(archive_entry_filetype(entry)) {
		case AE_IFREG:
			if (archive_entry_size(entry) == 0) {
				/* More portable than "touch." */
				archive_string_sprintf(&shar->work,
				    "test -e \"%s\" || :> \"%s\"\n",
				    shar->quoted_name.s, shar->quoted_name.s);
			} else {
				if (shar->dump) {
					unsigned int mode = archive_entry_mode(entry) & 0777;
					archive_string_sprintf(&shar->work,
					    "uudecode -p > %s << 'SHAR_END'\n",
					    shar->quoted_name.s);
					archive_string_sprintf(&shar->work,
					    "begin %o ", mode);
					shar_quote(&shar->work, name, 0);
					archive_strcat(&shar->work, "\n");
				} else {
					archive_string_sprintf(&shar->work,
					    "sed 's/^X//' > %s << 'SHAR_END'\n",
					    shar->quoted_name.s);
				}
				shar->has_data = 1;
				shar->end_of_line = 1;
				shar->outpos = 0;
			}
			break;
		case AE_IFDIR:
			archive_string_sprintf(&shar->work,
			    "mkdir -p %s > /dev/null 2>&1\n",
			    shar->quoted_name.s);
			/* Record that we just created this directory. */
			if (shar->last_dir != NULL)
				free(shar->last_dir);

			shar->last_dir = strdup(name);
			/* Trim a trailing '/'. */
			pp = strrchr(shar->last_dir, '/');
			if (pp != NULL && pp[1] == '\0')
				*pp = '\0';
			/*
			 * TODO: Put dir name/mode on a list to be fixed
			 * up at end of archive.
			 */
			break;
		case AE_IFIFO:
			archive_string_sprintf(&shar->work,
			    "mkfifo %s\n", shar->quoted_name.s);
			break;
		case AE_IFCHR:
			archive_string_sprintf(&shar->work,
			    "mknod %s c %ju %ju\n", shar->quoted_name.s,
			    (uintmax_t)archive_entry_rdevmajor(entry),
			    (uintmax_t)archive_entry_rdevminor(entry));
			break;
		case AE_IFBLK:
			archive_string_sprintf(&shar->work,
			    "mknod %s b %ju %ju\n", shar->quoted_name.s,
			    (uintmax_t)archive_entry_rdevmajor(entry),
			    (uintmax_t)archive_entry_rdevminor(entry));
			break;
		default:
			return (ARCHIVE_WARN);
		}
	}

	return (ARCHIVE_OK);
}